

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

void __thiscall
quic::Bbr2ProbeBwMode::EnterProbeDown
          (Bbr2ProbeBwMode *this,bool probed_too_high,bool stopped_risky_probe,QuicTime now)

{
  QuicConnectionStats *pQVar1;
  Bbr2Sender *pBVar2;
  Bbr2Params *pBVar3;
  uint64_t uVar4;
  Delta rhs;
  Delta DVar5;
  unsigned_long uVar6;
  bool stopped_risky_probe_local;
  bool probed_too_high_local;
  Bbr2ProbeBwMode *this_local;
  QuicTime now_local;
  
  this->last_cycle_probed_too_high_ = probed_too_high;
  this->last_cycle_stopped_risky_probe_ = stopped_risky_probe;
  this_local = (Bbr2ProbeBwMode *)now.time_;
  QuicTime::operator=(&(this->cycle_).cycle_start_time,(QuicTime *)&this_local);
  (this->cycle_).phase = PROBE_DOWN;
  (this->cycle_).rounds_in_phase = 0;
  QuicTime::operator=(&(this->cycle_).phase_start_time,(QuicTime *)&this_local);
  pQVar1 = ((this->super_Bbr2ModeBase).sender_)->connection_stats_;
  pQVar1->bbr_num_cycles = pQVar1->bbr_num_cycles + 1;
  pBVar2 = (this->super_Bbr2ModeBase).sender_;
  pBVar3 = Params(this);
  uVar4 = Bbr2Sender::RandomUint64(pBVar2,pBVar3->probe_bw_max_probe_rand_rounds);
  (this->cycle_).rounds_since_probe = uVar4;
  pBVar3 = Params(this);
  DVar5.time_offset_ = (pBVar3->probe_bw_probe_base_duration).time_offset_;
  pBVar2 = (this->super_Bbr2ModeBase).sender_;
  pBVar3 = Params(this);
  uVar4 = QuicTime::Delta::ToMicroseconds(&pBVar3->probe_bw_probe_max_rand_duration);
  uVar4 = Bbr2Sender::RandomUint64(pBVar2,uVar4);
  rhs = QuicTime::Delta::FromMicroseconds(uVar4);
  DVar5 = operator+(DVar5,rhs);
  (this->cycle_).probe_wait_time.time_offset_ = DVar5.time_offset_;
  uVar6 = std::numeric_limits<unsigned_long>::max();
  (this->cycle_).probe_up_bytes = uVar6;
  (this->cycle_).has_advanced_max_bw = false;
  Bbr2NetworkModel::RestartRound((this->super_Bbr2ModeBase).model_);
  return;
}

Assistant:

void Bbr2ProbeBwMode::EnterProbeDown(bool probed_too_high,
                                     bool stopped_risky_probe,
                                     QuicTime now) {
  /*QUIC_DVLOG(2) << sender_ << " Phase change: " << cycle_.phase << " ==> "
                << CyclePhase::PROBE_DOWN << " after "
                << now - cycle_.phase_start_time << ", or "
                << cycle_.rounds_in_phase
                << " rounds. probed_too_high:" << probed_too_high
                << ", stopped_risky_probe:" << stopped_risky_probe << "  @ "
                << now;*/
  last_cycle_probed_too_high_ = probed_too_high;
  last_cycle_stopped_risky_probe_ = stopped_risky_probe;

  cycle_.cycle_start_time = now;
  cycle_.phase = CyclePhase::PROBE_DOWN;
  cycle_.rounds_in_phase = 0;
  cycle_.phase_start_time = now;
  ++sender_->connection_stats_->bbr_num_cycles;

  // Pick probe wait time.
  cycle_.rounds_since_probe =
      sender_->RandomUint64(Params().probe_bw_max_probe_rand_rounds);
  cycle_.probe_wait_time =
      Params().probe_bw_probe_base_duration +
      QuicTime::Delta::FromMicroseconds(sender_->RandomUint64(
          Params().probe_bw_probe_max_rand_duration.ToMicroseconds()));

  cycle_.probe_up_bytes = std::numeric_limits<QuicByteCount>::max();
  cycle_.has_advanced_max_bw = false;
  model_->RestartRound();
}